

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * parse_hdr_field(VrplibParser *p,char *fieldname)

{
  char *__src;
  _Bool _Var1;
  bool bVar2;
  char *value;
  ptrdiff_t namesize;
  _Bool is_newline;
  char *at;
  char *fieldname_local;
  VrplibParser *p_local;
  
  _Var1 = parser_match_string(p,fieldname);
  if (_Var1) {
    parser_eat_whitespaces(p);
    _Var1 = parser_match_string(p,":");
    if (_Var1) {
      __src = p->at;
      while (_Var1 = parser_is_eof(p), ((_Var1 ^ 0xffU) & 1) != 0) {
        bVar2 = true;
        if (*p->at != '\r') {
          bVar2 = *p->at == '\n';
        }
        if (bVar2) break;
        parser_adv(p,1);
      }
      value = p->at + -(long)__src;
      _Var1 = parser_match_newline(p);
      if (_Var1) {
        while( true ) {
          bVar2 = false;
          if ((0 < (long)value) && (bVar2 = true, __src[(long)(value + -1)] != ' ')) {
            bVar2 = __src[(long)(value + -1)] == '\t';
          }
          if (!bVar2) break;
          value = value + -1;
        }
        p_local = (VrplibParser *)malloc((size_t)(value + 1));
        value[(long)&p_local->filename] = '\0';
        strncpy((char *)p_local,__src,(size_t)value);
      }
      else {
        p_local = (VrplibParser *)0x0;
      }
    }
    else {
      p_local = (VrplibParser *)0x0;
    }
  }
  else {
    p_local = (VrplibParser *)0x0;
  }
  return (char *)p_local;
}

Assistant:

static char *parse_hdr_field(VrplibParser *p, char *fieldname) {
    if (parser_match_string(p, fieldname)) {
        parser_eat_whitespaces(p);

        if (parser_match_string(p, ":")) {
            char *at = p->at;

            while (!parser_is_eof(p)) {
                bool is_newline = (*p->at == '\r' || *p->at == '\n');
                if (is_newline) {
                    break;
                }
                parser_adv(p, 1);
            }

            ptrdiff_t namesize = p->at - at;

            // Match end of line
            if (!parser_match_newline(p)) {
                return NULL;
            }

            // Walk string backwards and trim any trailing whitespace
            while (namesize > 0 &&
                   (at[namesize - 1] == ' ' || at[namesize - 1] == '\t')) {
                namesize--;
            }

            char *value = malloc(namesize + 1);
            value[namesize] = 0;
            strncpy(value, at, namesize);
            return value;
        } else {
            return NULL;
        }
    }

    return NULL;
}